

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::Dump(Instr *this,int window)

{
  bool bVar1;
  Instr *pIVar2;
  int iVar3;
  Instr *pIVar4;
  
  Output::Print(L"-------------------------------------------------------------------------------");
  pIVar2 = this;
  iVar3 = 0;
  do {
    pIVar4 = pIVar2;
    if (pIVar4->m_prev == (Instr *)0x0) break;
    bVar1 = iVar3 < window / 2;
    pIVar2 = pIVar4->m_prev;
    iVar3 = iVar3 + 1;
  } while (bVar1);
  for (iVar3 = 0; (pIVar4 != (Instr *)0x0 && (iVar3 < window)); iVar3 = iVar3 + 1) {
    if (pIVar4 == this) {
      Output::Print(L"=>");
    }
    (**pIVar4->_vptr_Instr)(pIVar4,0);
    pIVar4 = pIVar4->m_next;
  }
  return;
}

Assistant:

void
Instr::Dump(int window)
{
    Instr * instr;
    int i;

    Output::Print(_u("-------------------------------------------------------------------------------"));

    if (this == NULL)
    {
        return;
    }

    for (i = 0, instr = this; (instr->m_prev != NULL && i < window/2); instr = instr->m_prev, ++i)
    {} // Nothing


    for (i = 0; (instr != nullptr && i < window); instr = instr->m_next, ++i)
    {
        if (instr == this)
        {
            Output::Print(_u("=>"));
        }
        instr->Dump();
    }
}